

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dimension_holders.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_down
          (Matrix_all_dimension_holder<int> *this,uint dimension)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  
  puVar1 = (this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1[dimension] = puVar1[dimension] - 1;
  puVar3 = (this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while ((puVar4 = puVar3 + -1, puVar2 = puVar1, puVar3 != puVar1 && (puVar2 = puVar3, *puVar4 == 0)
         )) {
    (this->dimensions_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
    puVar3 = puVar4;
  }
  this->maxDim_ = (int)((ulong)((long)puVar2 - (long)puVar1) >> 2) + -1;
  return;
}

Assistant:

void update_down(unsigned int dimension) {
    --(dimensions_[dimension]);  // assumes dimension already exists and is not 0
    while (!dimensions_.empty() && dimensions_.back() == 0) dimensions_.pop_back();
    maxDim_ = dimensions_.size() - 1;
  }